

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O1

CatalogTransaction * __thiscall
duckdb::CatalogSetSecretStorage::GetTransactionOrDefault
          (CatalogTransaction *__return_storage_ptr__,CatalogSetSecretStorage *this,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  DatabaseInstance *pDVar1;
  ClientContext *pCVar2;
  transaction_t tVar3;
  optional_ptr<duckdb::CatalogTransaction,_true> local_18;
  
  local_18.ptr = transaction.ptr;
  if (transaction.ptr == (CatalogTransaction *)0x0) {
    CatalogTransaction::GetSystemTransaction(__return_storage_ptr__,this->db);
  }
  else {
    optional_ptr<duckdb::CatalogTransaction,_true>::CheckValid(&local_18);
    __return_storage_ptr__->start_time = (local_18.ptr)->start_time;
    pDVar1 = ((local_18.ptr)->db).ptr;
    pCVar2 = ((local_18.ptr)->context).ptr;
    tVar3 = (local_18.ptr)->transaction_id;
    (__return_storage_ptr__->transaction).ptr = ((local_18.ptr)->transaction).ptr;
    __return_storage_ptr__->transaction_id = tVar3;
    (__return_storage_ptr__->db).ptr = pDVar1;
    (__return_storage_ptr__->context).ptr = pCVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

CatalogTransaction CatalogSetSecretStorage::GetTransactionOrDefault(optional_ptr<CatalogTransaction> transaction) {
	if (transaction) {
		return *transaction;
	}
	return CatalogTransaction::GetSystemTransaction(db);
}